

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error
ft_stroke_border_get_counts
          (SW_FT_StrokeBorder border,SW_FT_UInt *anum_points,SW_FT_UInt *anum_contours)

{
  byte bVar1;
  SW_FT_UInt SVar2;
  SW_FT_UInt SVar3;
  long lVar4;
  bool bVar5;
  
  SVar2 = border->num_points;
  SVar3 = 0;
  bVar5 = false;
  for (lVar4 = 0; SVar2 != (SW_FT_UInt)lVar4; lVar4 = lVar4 + 1) {
    bVar1 = border->tags[lVar4];
    if (((bVar1 & 4) == 0) == !bVar5) goto LAB_0010a388;
    bVar5 = (bVar1 & 8) == 0;
    SVar3 = SVar3 + ((bVar1 & 8) >> 3);
  }
  if (bVar5) {
LAB_0010a388:
    SVar2 = 0;
    SVar3 = 0;
  }
  else {
    border->valid = '\x01';
  }
  *anum_points = SVar2;
  *anum_contours = SVar3;
  return SVar2;
}

Assistant:

static SW_FT_Error ft_stroke_border_get_counts(SW_FT_StrokeBorder border,
                                               SW_FT_UInt*        anum_points,
                                               SW_FT_UInt*        anum_contours)
{
    SW_FT_Error error = 0;
    SW_FT_UInt  num_points = 0;
    SW_FT_UInt  num_contours = 0;

    SW_FT_UInt    count = border->num_points;
    SW_FT_Vector* point = border->points;
    SW_FT_Byte*   tags = border->tags;
    SW_FT_Int     in_contour = 0;

    for (; count > 0; count--, num_points++, point++, tags++) {
        if (tags[0] & SW_FT_STROKE_TAG_BEGIN) {
            if (in_contour != 0) goto Fail;

            in_contour = 1;
        } else if (in_contour == 0)
            goto Fail;

        if (tags[0] & SW_FT_STROKE_TAG_END) {
            in_contour = 0;
            num_contours++;
        }
    }

    if (in_contour != 0) goto Fail;

    border->valid = TRUE;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;

Fail:
    num_points = 0;
    num_contours = 0;
    goto Exit;
}